

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

size_t __thiscall adios2::IO::AddTransport(IO *this,string *type,Params *parameters)

{
  IO *pIVar1;
  pointer pcVar2;
  size_t sVar3;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pIVar1 = this->m_IO;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"in call to IO::AddTransport","");
  helper::CheckForNullptr<adios2::core::IO>(pIVar1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pIVar1 = this->m_IO;
  pcVar2 = (type->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + type->_M_string_length);
  sVar3 = adios2::core::IO::AddTransport(pIVar1,(string *)local_70,parameters);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return sVar3;
}

Assistant:

size_t IO::AddTransport(const std::string type, const Params &parameters)
{
    helper::CheckForNullptr(m_IO, "in call to IO::AddTransport");
    return m_IO->AddTransport(type, parameters);
}